

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

void Llb_NonlinRemoveVar(Llb_Mgr_t *p,Llb_Var_t *pVar)

{
  if (p->pVars[pVar->iVar] == pVar) {
    p->pVars[pVar->iVar] = (Llb_Var_t *)0x0;
    Vec_IntFree(pVar->vParts);
    free(pVar);
    return;
  }
  __assert_fail("p->pVars[pVar->iVar] == pVar",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb3Image.c"
                ,0x66,"void Llb_NonlinRemoveVar(Llb_Mgr_t *, Llb_Var_t *)");
}

Assistant:

void Llb_NonlinRemoveVar( Llb_Mgr_t * p, Llb_Var_t * pVar )
{
    assert( p->pVars[pVar->iVar] == pVar );
    p->pVars[pVar->iVar] = NULL;
    Vec_IntFree( pVar->vParts );
    ABC_FREE( pVar );
}